

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC4880.cpp
# Opt level: O0

bool RFC4880::PBEDeriveKey(ByteString *password,ByteString *salt,AESKey **ppKey)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  void *pvVar6;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ByteString intermediate;
  HashAlgorithm *hash;
  uint iter;
  size_t in_stack_ffffffffffffff58;
  ByteString *in_stack_ffffffffffffff60;
  undefined1 local_58 [40];
  long *local_30;
  int local_24;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar3 = ByteString::size((ByteString *)0x1c766c);
  if (sVar3 < 8) {
    softHSMLog(3,"PBEDeriveKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/RFC4880.cpp"
               ,0x2e,"Insufficient salt data supplied for password-based encryption");
    local_1 = 0;
  }
  else {
    sVar3 = ByteString::size((ByteString *)0x1c76b2);
    if ((sVar3 == 0) || (local_20 == (undefined8 *)0x0)) {
      local_1 = 0;
    }
    else {
      ByteString::size((ByteString *)0x1c76ea);
      pbVar4 = ByteString::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_24 = *pbVar4 + 0x5dc;
      pCVar5 = CryptoFactory::i();
      iVar2 = (*pCVar5->_vptr_CryptoFactory[4])(pCVar5,4);
      local_30 = (long *)CONCAT44(extraout_var,iVar2);
      if (local_30 == (long *)0x0) {
        softHSMLog(3,"PBEDeriveKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/RFC4880.cpp"
                   ,0x41,"Could not get a SHA-256 instance");
        local_1 = 0;
      }
      else {
        ByteString::ByteString((ByteString *)0x1c7767);
        bVar1 = (**(code **)(*local_30 + 0x10))();
        if (((((bVar1 & 1) == 0) ||
             (bVar1 = (**(code **)(*local_30 + 0x18))(local_30,local_18), (bVar1 & 1) == 0)) ||
            (bVar1 = (**(code **)(*local_30 + 0x18))(local_30,local_10), (bVar1 & 1) == 0)) ||
           (bVar1 = (**(code **)(*local_30 + 0x20))(local_30,local_58), (bVar1 & 1) == 0)) {
          softHSMLog(3,"PBEDeriveKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/RFC4880.cpp"
                     ,0x4f,"Hashing failed");
          pCVar5 = CryptoFactory::i();
          (*pCVar5->_vptr_CryptoFactory[5])(pCVar5,local_30);
          local_1 = 0;
        }
        else {
          do {
            local_24 = local_24 + -1;
            if (local_24 == 0) {
              pvVar6 = operator_new(0x38);
              AESKey::AESKey((AESKey *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
              *local_20 = pvVar6;
              (**(code **)(*(long *)*local_20 + 0x18))((long *)*local_20,local_58);
              pCVar5 = CryptoFactory::i();
              (*pCVar5->_vptr_CryptoFactory[5])(pCVar5,local_30);
              local_1 = 1;
              goto LAB_001c79e2;
            }
            bVar1 = (**(code **)(*local_30 + 0x10))();
          } while ((((bVar1 & 1) != 0) &&
                   (bVar1 = (**(code **)(*local_30 + 0x18))(local_30,local_58), (bVar1 & 1) != 0))
                  && (bVar1 = (**(code **)(*local_30 + 0x20))(local_30,local_58), (bVar1 & 1) != 0))
          ;
          softHSMLog(3,"PBEDeriveKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/RFC4880.cpp"
                     ,0x5d,"Hashing failed");
          pCVar5 = CryptoFactory::i();
          (*pCVar5->_vptr_CryptoFactory[5])(pCVar5,local_30);
          local_1 = 0;
        }
LAB_001c79e2:
        ByteString::~ByteString((ByteString *)0x1c79ec);
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RFC4880::PBEDeriveKey(const ByteString& password, ByteString& salt, AESKey** ppKey)
{
	// Check that a proper salt value was supplied; it should be at least 8 bytes long
	if (salt.size() < 8)
	{
		ERROR_MSG("Insufficient salt data supplied for password-based encryption");

		return false;
	}

	// Check other parameters
	if ((password.size() == 0) || (ppKey == NULL))
	{
		return false;
	}

	// Determine the iteration count based on the last byte of the salt
	unsigned int iter = PBE_ITERATION_BASE_COUNT + salt[salt.size() - 1];

	// Get a hash instance
	HashAlgorithm* hash = CryptoFactory::i()->getHashAlgorithm(HashAlgo::SHA256);

	if (hash == NULL)
	{
		ERROR_MSG("Could not get a SHA-256 instance");

		return false;
	}

	// Perform the first iteration which takes as input the salt value and
	// the password
	ByteString intermediate;

	if (!hash->hashInit() ||
	    !hash->hashUpdate(salt) ||
	    !hash->hashUpdate(password) ||
	    !hash->hashFinal(intermediate))
	{
		ERROR_MSG("Hashing failed");

		CryptoFactory::i()->recycleHashAlgorithm(hash);

		return false;
	}

	// Perform the remaining iteration
	while (--iter > 0)
	{
		if (!hash->hashInit() ||
		    !hash->hashUpdate(intermediate) ||
		    !hash->hashFinal(intermediate))
		{
			ERROR_MSG("Hashing failed");

			CryptoFactory::i()->recycleHashAlgorithm(hash);

			return false;
		}
	}

	// Create the AES key instance
	*ppKey = new AESKey(256);
	(*ppKey)->setKeyBits(intermediate);

	// Release the hash instance
	CryptoFactory::i()->recycleHashAlgorithm(hash);

	return true;
}